

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O0

bool __thiscall
deqp::gls::FboUtil::ValidStatusCodes::isErrorCodeValid(ValidStatusCodes *this,GLenum errorCode)

{
  size_type sVar1;
  const_reference pvVar2;
  int local_20;
  int ndx;
  GLenum errorCode_local;
  ValidStatusCodes *this_local;
  
  if (errorCode == 0) {
    this_local._7_1_ =
         std::
         vector<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
         ::empty(&this->m_errorCodes);
  }
  else {
    for (local_20 = 0;
        sVar1 = std::
                vector<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
                ::size(&this->m_errorCodes), local_20 < (int)sVar1; local_20 = local_20 + 1) {
      pvVar2 = std::
               vector<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
               ::operator[](&this->m_errorCodes,(long)local_20);
      if (pvVar2->errorCode == errorCode) {
        return true;
      }
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ValidStatusCodes::isErrorCodeValid (glw::GLenum errorCode) const
{
	if (errorCode == GL_NO_ERROR)
		return m_errorCodes.empty();
	else
	{
		// rule violation exists?
		for (int ndx = 0; ndx < (int)m_errorCodes.size(); ++ndx)
		{
			if (m_errorCodes[ndx].errorCode == errorCode)
				return true;
		}
		return false;
	}
}